

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yin.c
# Opt level: O1

void yin_write(yin_t *pe,int16 *frame)

{
  ushort uVar1;
  int iVar2;
  fixed32 *pfVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint16 uVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint32 dshift;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int16 *piVar18;
  ulong uVar19;
  ulong uVar20;
  
  bVar5 = pe->wstart + 1;
  iVar12 = 0;
  bVar6 = bVar5;
  if (bVar5 == pe->wsize) {
    bVar6 = 0;
  }
  pe->wstart = bVar6;
  uVar1 = pe->frame_size;
  uVar19 = (ulong)(uint)(uVar1 >> 1);
  pfVar3 = pe->diff_window[(ulong)bVar5 - 1];
  *pfVar3 = 0x8000;
  do {
    if (((uint)(uVar1 >> 1) << ((byte)iVar12 & 0x1f) & 0x80000000) != 0) goto LAB_0010512c;
    iVar12 = iVar12 + 1;
  } while (iVar12 != 0x20);
  iVar12 = 0x20;
LAB_0010512c:
  if (3 < uVar1) {
    bVar6 = (char)iVar12 - 1;
    uVar20 = 1;
    uVar17 = 1L << (bVar6 & 0x3f);
    piVar18 = frame + 1;
    uVar14 = 0;
    uVar16 = 0;
    do {
      uVar8 = 0;
      uVar15 = 0;
      uVar11 = 0;
      do {
        uVar15 = uVar15 + (uVar17 < uVar11);
        bVar9 = (byte)uVar15;
        uVar10 = ((uint)(((int)frame[uVar8] - (int)piVar18[uVar8]) *
                        ((int)frame[uVar8] - (int)piVar18[uVar8])) >> (bVar9 & 0x1f)) +
                 ((uint)uVar11 >> (uVar17 < uVar11));
        uVar11 = (ulong)uVar10;
        uVar8 = uVar8 + 1;
      } while (uVar19 != uVar8);
      bVar4 = (char)uVar16 - bVar9;
      uVar13 = uVar10 >> (bVar4 & 0x1f);
      if (uVar16 < uVar15) {
        uVar13 = uVar10 << (-bVar4 & 0x1f);
      }
      uVar13 = uVar13 + uVar14;
      uVar8 = (ulong)uVar13;
      if (uVar17 < uVar8) {
        do {
          uVar8 = uVar8 >> 1;
          uVar13 = (uint)uVar8;
          uVar16 = uVar16 + 1;
        } while ((uint)uVar17 < uVar13);
      }
      uVar14 = uVar13 + (uVar13 == 0);
      pfVar3[uVar20] =
           (fixed32)(((ulong)(uint)((int)uVar20 << (bVar6 & 0x1f)) / (ulong)uVar14) * uVar11 >>
                    ((((char)iVar12 + -0x10) - bVar9) + (char)uVar16 & 0x3f));
      uVar20 = uVar20 + 1;
      piVar18 = piVar18 + 1;
    } while (uVar20 != uVar19);
  }
  uVar17 = 0;
  uVar7 = 0;
  if (1 < uVar1) {
    iVar12 = 0x7fffffff;
    uVar20 = 0;
    do {
      iVar2 = pfVar3[uVar20];
      if (iVar2 < iVar12) {
        uVar17 = uVar20 & 0xffffffff;
      }
      if (iVar2 < (int)(uint)pe->search_threshold) {
        uVar17 = uVar20 & 0xffffffff;
      }
      uVar7 = (uint16)uVar17;
      if (iVar2 < (int)(uint)pe->search_threshold) break;
      if (iVar2 < iVar12) {
        iVar12 = iVar2;
      }
      uVar20 = uVar20 + 1;
    } while (uVar19 != uVar20);
  }
  pe->period_window[(ulong)bVar5 - 1] = uVar7;
  pe->nfr = pe->nfr + 1;
  return;
}

Assistant:

void
yin_write(yin_t *pe, int16 const *frame)
{
    int outptr, difflen;

    /* Rotate the window one frame forward. */
    ++pe->wstart;
    /* Fill in the frame before wstart. */
    outptr = pe->wstart - 1;
    /* Wrap around the window pointer. */
    if (pe->wstart == pe->wsize)
        pe->wstart = 0;

    /* Now calculate normalized difference function. */
    difflen = pe->frame_size / 2;
    cmn_diff(frame, pe->diff_window[outptr], difflen);

    /* Find the first point under threshold.  If not found, then
     * use the absolute minimum. */
    pe->period_window[outptr]
        = thresholded_search(pe->diff_window[outptr],
                             pe->search_threshold, 0, difflen);

    /* Increment total number of frames. */
    ++pe->nfr;
}